

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlossySpecular.h
# Opt level: O1

RGBColor __thiscall
pm::GlossySpecular::f(GlossySpecular *this,ShadeRecord *sr,Vector3 *wi,Vector3 *wo)

{
  float fVar1;
  float fVar2;
  float *in_R8;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  float fVar5;
  float fVar6;
  RGBColor RVar7;
  ulong uVar4;
  
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x0;
  *(undefined4 *)&(this->super_BRDF).samplerState_.count_ = 0;
  fVar3 = wi[3].y;
  fVar5 = wi[3].z;
  fVar1 = wi[4].x;
  fVar6 = fVar1 * wo->z + fVar3 * wo->x + fVar5 * wo->y;
  fVar3 = ((fVar1 + fVar1) * fVar6 - wo->z) * in_R8[2] +
          ((fVar3 + fVar3) * fVar6 - wo->x) * *in_R8 + ((fVar5 + fVar5) * fVar6 - wo->y) * in_R8[1];
  uVar4 = (ulong)(uint)fVar3;
  fVar5 = 0.0;
  if (0.0 < fVar3) {
    fVar1 = (sr->localHitPoint).y;
    fVar5 = (sr->localHitPoint).z;
    fVar6 = (sr->normal).x;
    fVar2 = (sr->normal).y;
    fVar3 = powf(fVar3,(sr->normal).z);
    uVar4 = CONCAT44(extraout_XMM0_Db,fVar3);
    fVar5 = fVar5 * fVar1 * fVar3;
    *(float *)&(this->super_BRDF)._vptr_BRDF = fVar5;
    *(float *)((long)&(this->super_BRDF)._vptr_BRDF + 4) = fVar6 * fVar1 * fVar3;
    *(float *)&(this->super_BRDF).samplerState_.count_ = fVar1 * fVar2 * fVar3;
  }
  RVar7.b = fVar5;
  RVar7.r = (float)(int)uVar4;
  RVar7.g = (float)(int)(uVar4 >> 0x20);
  return RVar7;
}

Assistant:

inline RGBColor GlossySpecular::f(const ShadeRecord &sr, const Vector3 &wi, const Vector3 &wo) const
{
	RGBColor L;
	const float nDotWi = dot(sr.normal, wi);
	Vector3 r(-wi + 2.0f * sr.normal * nDotWi);
	const float rDotWo = dot(r, wo);

	if (rDotWo > 0.0f)
		L = ks_ * cs_ * powf(rDotWo, exp_);

	return L;
}